

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O3

logical pnga_set_update5_info(Integer g_a)

{
  long lVar1;
  int *piVar2;
  long *plVar3;
  short sVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  C_Integer *pCVar11;
  global_array_t *pgVar12;
  int _d;
  Integer proc;
  logical lVar13;
  double *pdVar14;
  Integer *map;
  Integer *proclist;
  size_t sVar15;
  Integer IVar16;
  int *piVar17;
  int iVar18;
  logical lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  long *plVar23;
  C_Integer CVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  int _ndim_10;
  long ndim;
  int _ndim;
  Integer IVar30;
  int local_5b8;
  int _index [7];
  double *local_568;
  Integer _hi [7];
  Integer np;
  Integer plo_rem [7];
  char err_string [256];
  Integer plo_loc [7];
  Integer phi_rem [7];
  Integer width [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer shi_rem [7];
  Integer slo_rem [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer increment [7];
  Integer dims [7];
  
  proc = pnga_nodeid();
  lVar13 = pnga_has_ghosts(g_a);
  lVar19 = 1;
  if (lVar13 != 0) {
    lVar13 = gai_check_ghost_distr(g_a);
    pgVar12 = GA;
    if (lVar13 == 0) {
LAB_0018b12c:
      lVar19 = 0;
    }
    else {
      lVar1 = g_a + 1000;
      sVar4 = GA[lVar1].ndim;
      ndim = (long)sVar4;
      iVar6 = GA[lVar1].p_handle;
      iVar7 = GA[lVar1].elemsize;
      pdVar14 = (double *)malloc(ndim * 0x50);
      pgVar12[lVar1].cache = pdVar14;
      local_568 = GA[lVar1].cache;
      iVar8 = GA[lVar1].corner_flag;
      pnga_distribution(g_a,proc,lo_loc,hi_loc);
      IVar30 = GAnproc;
      if (0 < ndim) {
        lVar20 = 0;
        do {
          increment[lVar20] = 0;
          width[lVar20] = GA[g_a + 1000].width[lVar20];
          dims[lVar20] = GA[g_a + 1000].dims[lVar20];
          if ((lo_loc[lVar20] == 0) && (hi_loc[lVar20] == -1)) {
            *local_568 = 0.0;
            goto LAB_0018b12c;
          }
          lVar20 = lVar20 + 1;
        } while (ndim != lVar20);
      }
      map = (Integer *)malloc(GAnproc * 0x70 | 8);
      if (map == (Integer *)0x0) {
        pnga_error("pnga_set_update5_info:malloc failed (_ga_map)",0);
        IVar30 = GAnproc;
      }
      proclist = (Integer *)malloc(IVar30 << 3);
      if (proclist == (Integer *)0x0) {
        pnga_error("pnga_set_update5_info:malloc failed (_ga_proclist)",0);
      }
      if (0 < sVar4) {
        local_5b8 = (int)proc;
        lVar20 = 2;
        if (2 < ndim) {
          lVar20 = ndim;
        }
        lVar20 = lVar20 * 4 + -4;
        IVar30 = 0;
        do {
          lVar10 = width[IVar30];
          if (lVar10 != 0) {
            get_remote_block_neg(IVar30,ndim,lo_loc,hi_loc,slo_rem,shi_rem,dims,width);
            lVar13 = pnga_locate_region(g_a,slo_rem,shi_rem,map,proclist,&np);
            if (lVar13 == 0) {
              builtin_strncpy(err_string,"cannot locate region: ",0x17);
              strcpy(err_string + 0x16,GA[lVar1].name);
              sVar15 = strlen(err_string);
              sprintf(err_string + (int)sVar15," [%ld:%ld ",slo_rem[0],shi_rem[0]);
              sVar15 = strlen(err_string);
              iVar21 = (int)sVar15;
              IVar16 = pnga_ndim(g_a);
              if (1 < IVar16) {
                lVar25 = 1;
                do {
                  sprintf(err_string + (int)sVar15,",%ld:%ld ",slo_rem[lVar25],shi_rem[lVar25]);
                  sVar15 = strlen(err_string);
                  iVar21 = (int)sVar15;
                  lVar25 = lVar25 + 1;
                  IVar16 = pnga_ndim(g_a);
                } while (lVar25 < IVar16);
              }
              (err_string + iVar21)[0] = ']';
              (err_string + iVar21)[1] = '\0';
              pnga_error(err_string,g_a);
            }
            piVar17 = (int *)((long)local_568 + ndim * 4 + 0x10);
            piVar2 = piVar17 + ndim;
            plVar3 = (long *)(piVar2 + ndim);
            lVar25 = *proclist;
            *plVar3 = lVar25;
            if (-1 < iVar6) {
              lVar25 = (long)PGRP_LIST[iVar6].inv_map_proc_list[lVar25];
              *plVar3 = lVar25;
            }
            pnga_distribution(g_a,lVar25,tlo_rem,thi_rem);
            pgVar12 = GA;
            lVar25 = 0;
            do {
              if (increment[lVar25] == 0) {
                if (IVar30 == lVar25) {
                  lVar22 = width[IVar30];
                  plo_rem[IVar30] = lVar22 + (thi_rem[IVar30] - tlo_rem[IVar30]) + 1;
                  phi_rem[IVar30] = (thi_rem[IVar30] - tlo_rem[IVar30]) + lVar22 * 2;
                  plo_loc[IVar30] = lVar22;
                }
                else {
                  lVar22 = width[lVar25];
                  plo_rem[lVar25] = lVar22;
                  phi_rem[lVar25] = (thi_rem[lVar25] + lVar22) - tlo_rem[lVar25];
                  plo_loc[lVar25] = lVar22;
                }
              }
              else {
                plo_rem[lVar25] = 0;
                phi_rem[lVar25] = (increment[lVar25] + thi_rem[lVar25]) - tlo_rem[lVar25];
                plo_loc[lVar25] = 0;
              }
              lVar25 = lVar25 + 1;
            } while (ndim != lVar25);
            uVar5 = GA[lVar1].ndim;
            uVar28 = (ulong)(short)uVar5;
            iVar21 = GA[lVar1].distr_type;
            if (iVar21 - 1U < 3) {
              lVar25 = GA[lVar1].num_blocks[0];
              lVar22 = (long)local_5b8 % lVar25;
              _index[0] = (int)lVar22;
              if (1 < (short)uVar5) {
                lVar29 = 0;
                IVar16 = proc;
                do {
                  IVar16 = (long)((int)IVar16 - (int)lVar22) / lVar25;
                  lVar25 = GA[g_a + 1000].num_blocks[lVar29 + 1];
                  lVar22 = (long)(int)IVar16 % lVar25;
                  _index[lVar29 + 1] = (int)lVar22;
                  lVar29 = lVar29 + 1;
                } while ((uVar28 & 0xffffffff) - 1 != lVar29);
              }
              if (0 < (short)uVar5) {
                lVar25 = 0;
                do {
                  iVar18 = *(int *)((long)_index + lVar25);
                  lVar22 = *(long *)((long)GA[g_a + 1000].block_dims + lVar25 * 2);
                  *(long *)(err_string + lVar25 * 2) = lVar22 * iVar18 + 1;
                  lVar22 = ((long)iVar18 + 1) * lVar22;
                  lVar29 = *(long *)((long)GA[g_a + 1000].dims + lVar25 * 2);
                  if (lVar29 <= lVar22) {
                    lVar22 = lVar29;
                  }
                  *(long *)((long)_hi + lVar25 * 2) = lVar22;
                  lVar25 = lVar25 + 4;
                } while ((uVar28 & 0xffffffff) << 2 != lVar25);
              }
            }
            else if (iVar21 == 4) {
              lVar25 = GA[lVar1].num_blocks[0];
              lVar22 = (long)local_5b8 % lVar25;
              _index[0] = (int)lVar22;
              if (1 < (short)uVar5) {
                lVar29 = 0;
                IVar16 = proc;
                do {
                  IVar16 = (long)((int)IVar16 - (int)lVar22) / lVar25;
                  lVar25 = GA[g_a + 1000].num_blocks[lVar29 + 1];
                  lVar22 = (long)(int)IVar16 % lVar25;
                  _index[lVar29 + 1] = (int)lVar22;
                  lVar29 = lVar29 + 1;
                } while ((uVar28 & 0xffffffff) - 1 != lVar29);
              }
              if (0 < (short)uVar5) {
                pCVar11 = GA[lVar1].mapc;
                lVar25 = 0;
                iVar18 = 0;
                do {
                  iVar9 = *(int *)((long)_index + lVar25);
                  lVar29 = (long)iVar18 + (long)iVar9;
                  *(C_Integer *)(err_string + lVar25 * 2) = pCVar11[lVar29];
                  lVar22 = *(long *)((long)GA[lVar1].num_blocks + lVar25 * 2);
                  if ((long)iVar9 < lVar22 + -1) {
                    lVar29 = pCVar11[lVar29 + 1] + -1;
                  }
                  else {
                    lVar29 = *(long *)((long)GA[lVar1].dims + lVar25 * 2);
                  }
                  *(long *)((long)_hi + lVar25 * 2) = lVar29;
                  iVar18 = iVar18 + (int)lVar22;
                  lVar25 = lVar25 + 4;
                } while ((uVar28 & 0xffffffff) << 2 != lVar25);
              }
            }
            else if (iVar21 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                if (0 < (short)uVar5) {
                  lVar25 = 1;
                  uVar26 = 0;
                  do {
                    lVar25 = lVar25 * GA[g_a + 1000].nblock[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar28 != uVar26);
                  if ((proc < 0) || (lVar25 <= proc)) goto LAB_00189e70;
                  if (0 < (short)uVar5) {
                    pCVar11 = GA[lVar1].mapc;
                    uVar26 = 0;
                    lVar25 = 0;
                    IVar16 = proc;
                    do {
                      lVar29 = (long)GA[g_a + 1000].nblock[uVar26];
                      lVar22 = IVar16 % lVar29;
                      plo_loc[uVar26 - 0x20] = pCVar11[lVar22 + lVar25];
                      if (lVar22 == lVar29 + -1) {
                        CVar24 = GA[g_a + 1000].dims[uVar26];
                      }
                      else {
                        CVar24 = pCVar11[lVar22 + lVar25 + 1] + -1;
                      }
                      lVar25 = lVar25 + lVar29;
                      _hi[uVar26] = CVar24;
                      uVar26 = uVar26 + 1;
                      IVar16 = IVar16 / lVar29;
                    } while (uVar28 != uVar26);
                  }
                }
              }
              else if (proc < GA[lVar1].num_rstrctd) {
                if (0 < (short)uVar5) {
                  lVar25 = 1;
                  uVar26 = 0;
                  do {
                    lVar25 = lVar25 * GA[g_a + 1000].nblock[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar28 != uVar26);
                  if ((proc < 0) || (lVar25 <= proc)) goto LAB_00189e70;
                  if (0 < (short)uVar5) {
                    pCVar11 = GA[lVar1].mapc;
                    uVar26 = 0;
                    lVar25 = 0;
                    IVar16 = proc;
                    do {
                      lVar29 = (long)GA[g_a + 1000].nblock[uVar26];
                      lVar22 = IVar16 % lVar29;
                      plo_loc[uVar26 - 0x20] = pCVar11[lVar22 + lVar25];
                      if (lVar22 == lVar29 + -1) {
                        CVar24 = GA[g_a + 1000].dims[uVar26];
                      }
                      else {
                        CVar24 = pCVar11[lVar22 + lVar25 + 1] + -1;
                      }
                      lVar25 = lVar25 + lVar29;
                      _hi[uVar26] = CVar24;
                      uVar26 = uVar26 + 1;
                      IVar16 = IVar16 / lVar29;
                    } while (uVar28 != uVar26);
                  }
                }
              }
              else {
LAB_00189e70:
                if (0 < (short)uVar5) {
                  memset(err_string,0,uVar28 * 8);
                  memset(_hi,0xff,uVar28 * 8);
                }
              }
            }
            if (uVar28 == 1) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar12[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar5 < 2) {
              lVar25 = 1;
              lVar22 = 0;
            }
            else {
              lVar25 = 1;
              lVar29 = 0;
              lVar22 = 0;
              do {
                lVar22 = lVar22 + plo_loc[lVar29] * lVar25;
                lVar27 = (_hi[lVar29] - plo_loc[lVar29 + -0x20]) +
                         pgVar12[g_a + 1000].width[lVar29] * 2 + 1;
                ld_loc[lVar29] = lVar27;
                lVar25 = lVar25 * lVar27;
                lVar29 = lVar29 + 1;
              } while (uVar28 - 1 != lVar29);
            }
            iVar18 = pgVar12[lVar1].elemsize;
            local_568[1] = (double)(pgVar12[lVar1].ptr[proc] +
                                   (lVar25 * plo_loc[uVar28 - 1] + lVar22) * (long)iVar18);
            if (iVar21 - 1U < 3) {
              lVar25 = *plVar3;
              lVar22 = pgVar12[lVar1].num_blocks[0];
              lVar29 = (long)(int)lVar25 % lVar22;
              _index[0] = (int)lVar29;
              if (1 < (short)uVar5) {
                lVar27 = 0;
                do {
                  lVar25 = (long)((int)lVar25 - (int)lVar29) / lVar22;
                  lVar22 = pgVar12[g_a + 1000].num_blocks[lVar27 + 1];
                  lVar29 = (long)(int)lVar25 % lVar22;
                  _index[lVar27 + 1] = (int)lVar29;
                  lVar27 = lVar27 + 1;
                } while ((uVar28 & 0xffffffff) - 1 != lVar27);
              }
              if (0 < (short)uVar5) {
                lVar25 = 0;
                do {
                  iVar21 = *(int *)((long)_index + lVar25);
                  lVar22 = *(long *)((long)pgVar12[g_a + 1000].block_dims + lVar25 * 2);
                  *(long *)(err_string + lVar25 * 2) = lVar22 * iVar21 + 1;
                  lVar22 = ((long)iVar21 + 1) * lVar22;
                  lVar29 = *(long *)((long)pgVar12[g_a + 1000].dims + lVar25 * 2);
                  if (lVar29 <= lVar22) {
                    lVar22 = lVar29;
                  }
                  *(long *)((long)_hi + lVar25 * 2) = lVar22;
                  lVar25 = lVar25 + 4;
                } while ((uVar28 & 0xffffffff) << 2 != lVar25);
              }
            }
            else if (iVar21 == 4) {
              lVar25 = *plVar3;
              lVar22 = pgVar12[lVar1].num_blocks[0];
              lVar29 = (long)(int)lVar25 % lVar22;
              _index[0] = (int)lVar29;
              if (1 < (short)uVar5) {
                lVar27 = 0;
                do {
                  lVar25 = (long)((int)lVar25 - (int)lVar29) / lVar22;
                  lVar22 = pgVar12[g_a + 1000].num_blocks[lVar27 + 1];
                  lVar29 = (long)(int)lVar25 % lVar22;
                  _index[lVar27 + 1] = (int)lVar29;
                  lVar27 = lVar27 + 1;
                } while ((uVar28 & 0xffffffff) - 1 != lVar27);
              }
              if (0 < (short)uVar5) {
                pCVar11 = pgVar12[lVar1].mapc;
                lVar25 = 0;
                iVar21 = 0;
                do {
                  iVar9 = *(int *)((long)_index + lVar25);
                  lVar29 = (long)iVar21 + (long)iVar9;
                  *(C_Integer *)(err_string + lVar25 * 2) = pCVar11[lVar29];
                  lVar22 = *(long *)((long)pgVar12[lVar1].num_blocks + lVar25 * 2);
                  if ((long)iVar9 < lVar22 + -1) {
                    lVar29 = pCVar11[lVar29 + 1] + -1;
                  }
                  else {
                    lVar29 = *(long *)((long)pgVar12[lVar1].dims + lVar25 * 2);
                  }
                  *(long *)((long)_hi + lVar25 * 2) = lVar29;
                  iVar21 = iVar21 + (int)lVar22;
                  lVar25 = lVar25 + 4;
                } while ((uVar28 & 0xffffffff) << 2 != lVar25);
              }
            }
            else if (iVar21 == 0) {
              if (pgVar12[lVar1].num_rstrctd == 0) {
                if (0 < (short)uVar5) {
                  lVar25 = 1;
                  uVar26 = 0;
                  do {
                    lVar25 = lVar25 * pgVar12[g_a + 1000].nblock[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar28 != uVar26);
                  lVar22 = *plVar3;
                  if (lVar22 < 0 || lVar25 <= lVar22) {
LAB_0018a239:
                    uVar26 = uVar28;
                    if (0 < (short)uVar5) goto LAB_0018a255;
                  }
                  else if (0 < (short)uVar5) {
                    pCVar11 = pgVar12[lVar1].mapc;
                    lVar25 = 0;
                    uVar26 = 0;
                    do {
                      lVar27 = (long)pgVar12[g_a + 1000].nblock[uVar26];
                      lVar29 = lVar22 % lVar27;
                      plo_loc[uVar26 - 0x20] = pCVar11[lVar29 + lVar25];
                      if (lVar29 == lVar27 + -1) {
                        CVar24 = pgVar12[g_a + 1000].dims[uVar26];
                      }
                      else {
                        CVar24 = pCVar11[lVar29 + lVar25 + 1] + -1;
                      }
                      lVar25 = lVar25 + lVar27;
                      _hi[uVar26] = CVar24;
                      uVar26 = uVar26 + 1;
                      lVar22 = lVar22 / lVar27;
                    } while (uVar28 != uVar26);
                  }
                }
              }
              else {
                lVar25 = *plVar3;
                if (lVar25 < pgVar12[lVar1].num_rstrctd) {
                  if (0 < (short)uVar5) {
                    lVar22 = 1;
                    uVar26 = 0;
                    do {
                      lVar22 = lVar22 * pgVar12[g_a + 1000].nblock[uVar26];
                      uVar26 = uVar26 + 1;
                    } while (uVar28 != uVar26);
                    if ((lVar25 < 0) || (lVar22 <= lVar25)) goto LAB_0018a239;
                    if (0 < (short)uVar5) {
                      pCVar11 = pgVar12[lVar1].mapc;
                      lVar22 = 0;
                      uVar26 = 0;
                      do {
                        lVar27 = (long)pgVar12[g_a + 1000].nblock[uVar26];
                        lVar29 = lVar25 % lVar27;
                        plo_loc[uVar26 - 0x20] = pCVar11[lVar29 + lVar22];
                        if (lVar29 == lVar27 + -1) {
                          CVar24 = pgVar12[g_a + 1000].dims[uVar26];
                        }
                        else {
                          CVar24 = pCVar11[lVar29 + lVar22 + 1] + -1;
                        }
                        lVar22 = lVar22 + lVar27;
                        _hi[uVar26] = CVar24;
                        uVar26 = uVar26 + 1;
                        lVar25 = lVar25 / lVar27;
                      } while (uVar28 != uVar26);
                    }
                  }
                }
                else if (0 < (short)uVar5) {
                  uVar26 = (ulong)uVar5;
LAB_0018a255:
                  memset(err_string,0,uVar26 << 3);
                  memset(_hi,0xff,uVar26 << 3);
                }
              }
            }
            if (uVar28 == 1) {
              ld_rem[0] = (_hi[0] - err_string._0_8_) + pgVar12[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar5 < 2) {
              lVar25 = 1;
              lVar22 = 0;
            }
            else {
              lVar25 = 1;
              lVar29 = 0;
              lVar22 = 0;
              do {
                lVar22 = lVar22 + plo_rem[lVar29] * lVar25;
                lVar27 = (_hi[lVar29] - plo_loc[lVar29 + -0x20]) +
                         pgVar12[g_a + 1000].width[lVar29] * 2 + 1;
                ld_rem[lVar29] = lVar27;
                lVar25 = lVar25 * lVar27;
                lVar29 = lVar29 + 1;
              } while (uVar28 - 1 != lVar29);
            }
            *local_568 = (double)(pgVar12[lVar1].ptr[*plVar3] +
                                 (lVar25 * plo_rem[uVar28 - 1] + lVar22) * (long)iVar18);
            *(int *)(local_568 + 2) = iVar7;
            *piVar17 = iVar7;
            if (sVar4 != 1) {
              lVar25 = 0;
              iVar21 = iVar7;
              iVar18 = iVar7;
              do {
                iVar18 = iVar18 * *(int *)((long)ld_rem + lVar25 * 2);
                *(int *)((long)local_568 + lVar25 + ndim * 4 + 0x10) = iVar18;
                *(int *)((long)local_568 + lVar25 + 0x10) =
                     iVar21 * *(int *)((long)ld_loc + lVar25 * 2);
                *(int *)((long)local_568 + lVar25 + ndim * 4 + 0x14) = iVar18;
                iVar21 = *(int *)((long)local_568 + lVar25 + 0x10);
                *(int *)((long)local_568 + lVar25 + 0x14) = iVar21;
                lVar25 = lVar25 + 4;
              } while (lVar20 != lVar25);
            }
            lVar25 = 0;
            do {
              piVar2[lVar25] = ((int)phi_rem[lVar25] - (int)plo_rem[lVar25]) + 1;
              lVar25 = lVar25 + 1;
            } while (ndim != lVar25);
            *piVar2 = *piVar2 * iVar7;
            if (-1 < iVar6) {
              *plVar3 = (long)PGRP_LIST[iVar6].inv_map_proc_list[*plVar3];
            }
            get_remote_block_pos(IVar30,ndim,lo_loc,hi_loc,slo_rem,shi_rem,dims,width);
            lVar13 = pnga_locate_region(g_a,slo_rem,shi_rem,map,proclist,&np);
            if (lVar13 == 0) {
              builtin_strncpy(err_string,"cannot locate region: ",0x17);
              strcpy(err_string + 0x16,GA[lVar1].name);
              sVar15 = strlen(err_string);
              sprintf(err_string + (int)sVar15," [%ld:%ld ",slo_rem[0],shi_rem[0]);
              sVar15 = strlen(err_string);
              iVar21 = (int)sVar15;
              IVar16 = pnga_ndim(g_a);
              if (1 < IVar16) {
                lVar25 = 1;
                do {
                  sprintf(err_string + (int)sVar15,",%ld:%ld ",slo_rem[lVar25],shi_rem[lVar25]);
                  sVar15 = strlen(err_string);
                  iVar21 = (int)sVar15;
                  lVar25 = lVar25 + 1;
                  IVar16 = pnga_ndim(g_a);
                } while (lVar25 < IVar16);
              }
              (err_string + iVar21)[0] = ']';
              (err_string + iVar21)[1] = '\0';
              pnga_error(err_string,g_a);
            }
            piVar17 = (int *)((long)plVar3 + ndim * 4 + 0x18);
            piVar2 = piVar17 + ndim;
            plVar23 = (long *)(piVar2 + ndim);
            lVar25 = *proclist;
            *plVar23 = lVar25;
            if (-1 < iVar6) {
              lVar25 = (long)PGRP_LIST[iVar6].inv_map_proc_list[lVar25];
              *plVar23 = lVar25;
            }
            local_568 = (double *)(plVar23 + 1);
            pnga_distribution(g_a,lVar25,tlo_rem,thi_rem);
            pgVar12 = GA;
            lVar25 = 0;
            do {
              if (increment[lVar25] == 0) {
                if (IVar30 == lVar25) {
                  phi_rem[IVar30] = width[IVar30] + -1;
                  plo_rem[IVar30] = 0;
                  plo_loc[IVar30] = (width[IVar30] + -1 + hi_loc[IVar30]) - lo_loc[IVar30];
                }
                else {
                  lVar22 = width[lVar25];
                  plo_rem[lVar25] = lVar22;
                  phi_rem[lVar25] = (thi_rem[lVar25] + lVar22) - tlo_rem[lVar25];
                  plo_loc[lVar25] = lVar22;
                }
              }
              else {
                plo_rem[lVar25] = 0;
                phi_rem[lVar25] = (increment[lVar25] + thi_rem[lVar25]) - tlo_rem[lVar25];
                plo_loc[lVar25] = 0;
              }
              lVar25 = lVar25 + 1;
            } while (ndim != lVar25);
            uVar5 = GA[lVar1].ndim;
            uVar28 = (ulong)(short)uVar5;
            iVar21 = GA[lVar1].distr_type;
            if (iVar21 - 1U < 3) {
              lVar25 = GA[lVar1].num_blocks[0];
              lVar22 = (long)(int)GAme % lVar25;
              _index[0] = (int)lVar22;
              if (1 < (short)uVar5) {
                lVar29 = 0;
                IVar16 = GAme;
                do {
                  IVar16 = (long)((int)IVar16 - (int)lVar22) / lVar25;
                  lVar25 = GA[g_a + 1000].num_blocks[lVar29 + 1];
                  lVar22 = (long)(int)IVar16 % lVar25;
                  _index[lVar29 + 1] = (int)lVar22;
                  lVar29 = lVar29 + 1;
                } while ((uVar28 & 0xffffffff) - 1 != lVar29);
              }
              if (0 < (short)uVar5) {
                lVar25 = 0;
                do {
                  iVar21 = *(int *)((long)_index + lVar25);
                  lVar22 = *(long *)((long)GA[g_a + 1000].block_dims + lVar25 * 2);
                  *(long *)(err_string + lVar25 * 2) = lVar22 * iVar21 + 1;
                  lVar22 = ((long)iVar21 + 1) * lVar22;
                  lVar29 = *(long *)((long)GA[g_a + 1000].dims + lVar25 * 2);
                  if (lVar29 <= lVar22) {
                    lVar22 = lVar29;
                  }
                  *(long *)((long)_hi + lVar25 * 2) = lVar22;
                  lVar25 = lVar25 + 4;
                } while ((uVar28 & 0xffffffff) << 2 != lVar25);
              }
            }
            else if (iVar21 == 4) {
              lVar25 = GA[lVar1].num_blocks[0];
              lVar22 = (long)(int)GAme % lVar25;
              _index[0] = (int)lVar22;
              if (1 < (short)uVar5) {
                lVar29 = 0;
                IVar16 = GAme;
                do {
                  IVar16 = (long)((int)IVar16 - (int)lVar22) / lVar25;
                  lVar25 = GA[g_a + 1000].num_blocks[lVar29 + 1];
                  lVar22 = (long)(int)IVar16 % lVar25;
                  _index[lVar29 + 1] = (int)lVar22;
                  lVar29 = lVar29 + 1;
                } while ((uVar28 & 0xffffffff) - 1 != lVar29);
              }
              if (0 < (short)uVar5) {
                pCVar11 = GA[lVar1].mapc;
                lVar25 = 0;
                iVar21 = 0;
                do {
                  iVar18 = *(int *)((long)_index + lVar25);
                  lVar29 = (long)iVar21 + (long)iVar18;
                  *(C_Integer *)(err_string + lVar25 * 2) = pCVar11[lVar29];
                  lVar22 = *(long *)((long)GA[lVar1].num_blocks + lVar25 * 2);
                  if ((long)iVar18 < lVar22 + -1) {
                    lVar29 = pCVar11[lVar29 + 1] + -1;
                  }
                  else {
                    lVar29 = *(long *)((long)GA[lVar1].dims + lVar25 * 2);
                  }
                  *(long *)((long)_hi + lVar25 * 2) = lVar29;
                  iVar21 = iVar21 + (int)lVar22;
                  lVar25 = lVar25 + 4;
                } while ((uVar28 & 0xffffffff) << 2 != lVar25);
              }
            }
            else if (iVar21 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                if (0 < (short)uVar5) {
                  lVar25 = 1;
                  uVar26 = 0;
                  do {
                    lVar25 = lVar25 * GA[g_a + 1000].nblock[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar28 != uVar26);
                  if (GAme < 0 || lVar25 <= GAme) {
LAB_0018a9b3:
                    if (0 < (short)uVar5) {
                      sVar15 = uVar28 * 8;
                      goto LAB_0018a9d0;
                    }
                  }
                  else if (0 < (short)uVar5) {
                    pCVar11 = GA[lVar1].mapc;
                    lVar25 = 0;
                    uVar26 = 0;
                    IVar16 = GAme;
                    do {
                      lVar29 = (long)GA[g_a + 1000].nblock[uVar26];
                      lVar22 = IVar16 % lVar29;
                      plo_loc[uVar26 - 0x20] = pCVar11[lVar22 + lVar25];
                      if (lVar22 == lVar29 + -1) {
                        CVar24 = GA[g_a + 1000].dims[uVar26];
                      }
                      else {
                        CVar24 = pCVar11[lVar22 + lVar25 + 1] + -1;
                      }
                      lVar25 = lVar25 + lVar29;
                      _hi[uVar26] = CVar24;
                      uVar26 = uVar26 + 1;
                      IVar16 = IVar16 / lVar29;
                    } while (uVar28 != uVar26);
                  }
                }
              }
              else if (GAme < GA[lVar1].num_rstrctd) {
                if (0 < (short)uVar5) {
                  lVar25 = 1;
                  uVar26 = 0;
                  do {
                    lVar25 = lVar25 * GA[g_a + 1000].nblock[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar28 != uVar26);
                  if ((GAme < 0) || (lVar25 <= GAme)) goto LAB_0018a9b3;
                  if (0 < (short)uVar5) {
                    pCVar11 = GA[lVar1].mapc;
                    lVar25 = 0;
                    uVar26 = 0;
                    IVar16 = GAme;
                    do {
                      lVar29 = (long)GA[g_a + 1000].nblock[uVar26];
                      lVar22 = IVar16 % lVar29;
                      plo_loc[uVar26 - 0x20] = pCVar11[lVar22 + lVar25];
                      if (lVar22 == lVar29 + -1) {
                        CVar24 = GA[g_a + 1000].dims[uVar26];
                      }
                      else {
                        CVar24 = pCVar11[lVar22 + lVar25 + 1] + -1;
                      }
                      lVar25 = lVar25 + lVar29;
                      _hi[uVar26] = CVar24;
                      uVar26 = uVar26 + 1;
                      IVar16 = IVar16 / lVar29;
                    } while (uVar28 != uVar26);
                  }
                }
              }
              else if (0 < (short)uVar5) {
                sVar15 = (ulong)uVar5 << 3;
LAB_0018a9d0:
                memset(err_string,0,sVar15);
                memset(_hi,0xff,sVar15);
              }
            }
            if (uVar28 == 1) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar12[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar5 < 2) {
              lVar25 = 1;
              lVar22 = 0;
            }
            else {
              lVar25 = 1;
              lVar22 = 0;
              lVar29 = 0;
              do {
                lVar22 = lVar22 + plo_loc[lVar29] * lVar25;
                lVar27 = (_hi[lVar29] - plo_loc[lVar29 + -0x20]) +
                         pgVar12[g_a + 1000].width[lVar29] * 2 + 1;
                ld_loc[lVar29] = lVar27;
                lVar25 = lVar25 * lVar27;
                lVar29 = lVar29 + 1;
              } while (uVar28 - 1 != lVar29);
            }
            plVar3[2] = (long)(pgVar12[lVar1].ptr[GAme] +
                              (long)pgVar12[lVar1].elemsize *
                              (lVar25 * plo_loc[uVar28 - 1] + lVar22));
            pgVar12 = GA;
            uVar5 = GA[lVar1].ndim;
            uVar28 = (ulong)(short)uVar5;
            iVar21 = GA[lVar1].distr_type;
            if (iVar21 - 1U < 3) {
              lVar25 = *plVar23;
              lVar22 = GA[lVar1].num_blocks[0];
              lVar29 = (long)(int)lVar25 % lVar22;
              _index[0] = (int)lVar29;
              if (1 < (short)uVar5) {
                lVar27 = 0;
                do {
                  lVar25 = (long)((int)lVar25 - (int)lVar29) / lVar22;
                  lVar22 = GA[g_a + 1000].num_blocks[lVar27 + 1];
                  lVar29 = (long)(int)lVar25 % lVar22;
                  _index[lVar27 + 1] = (int)lVar29;
                  lVar27 = lVar27 + 1;
                } while ((uVar28 & 0xffffffff) - 1 != lVar27);
              }
              if (0 < (short)uVar5) {
                lVar25 = 0;
                do {
                  iVar21 = *(int *)((long)_index + lVar25);
                  lVar22 = *(long *)((long)GA[g_a + 1000].block_dims + lVar25 * 2);
                  *(long *)(err_string + lVar25 * 2) = lVar22 * iVar21 + 1;
                  lVar22 = ((long)iVar21 + 1) * lVar22;
                  lVar29 = *(long *)((long)GA[g_a + 1000].dims + lVar25 * 2);
                  if (lVar29 <= lVar22) {
                    lVar22 = lVar29;
                  }
                  *(long *)((long)_hi + lVar25 * 2) = lVar22;
                  lVar25 = lVar25 + 4;
                } while ((uVar28 & 0xffffffff) << 2 != lVar25);
              }
            }
            else if (iVar21 == 4) {
              lVar25 = *plVar23;
              lVar22 = GA[lVar1].num_blocks[0];
              lVar29 = (long)(int)lVar25 % lVar22;
              _index[0] = (int)lVar29;
              if (1 < (short)uVar5) {
                lVar27 = 0;
                do {
                  lVar25 = (long)((int)lVar25 - (int)lVar29) / lVar22;
                  lVar22 = GA[g_a + 1000].num_blocks[lVar27 + 1];
                  lVar29 = (long)(int)lVar25 % lVar22;
                  _index[lVar27 + 1] = (int)lVar29;
                  lVar27 = lVar27 + 1;
                } while ((uVar28 & 0xffffffff) - 1 != lVar27);
              }
              if (0 < (short)uVar5) {
                pCVar11 = GA[lVar1].mapc;
                lVar25 = 0;
                iVar21 = 0;
                do {
                  iVar18 = *(int *)((long)_index + lVar25);
                  lVar29 = (long)iVar21 + (long)iVar18;
                  *(C_Integer *)(err_string + lVar25 * 2) = pCVar11[lVar29];
                  lVar22 = *(long *)((long)GA[lVar1].num_blocks + lVar25 * 2);
                  if ((long)iVar18 < lVar22 + -1) {
                    lVar29 = pCVar11[lVar29 + 1] + -1;
                  }
                  else {
                    lVar29 = *(long *)((long)GA[lVar1].dims + lVar25 * 2);
                  }
                  *(long *)((long)_hi + lVar25 * 2) = lVar29;
                  iVar21 = iVar21 + (int)lVar22;
                  lVar25 = lVar25 + 4;
                } while ((uVar28 & 0xffffffff) << 2 != lVar25);
              }
            }
            else if (iVar21 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                if (0 < (short)uVar5) {
                  lVar25 = 1;
                  uVar26 = 0;
                  do {
                    lVar25 = lVar25 * GA[g_a + 1000].nblock[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar28 != uVar26);
                  lVar22 = *plVar23;
                  if (lVar22 < 0 || lVar25 <= lVar22) {
LAB_0018ada2:
                    if (0 < (short)uVar5) {
                      sVar15 = uVar28 * 8;
                      goto LAB_0018adbf;
                    }
                  }
                  else if (0 < (short)uVar5) {
                    pCVar11 = GA[lVar1].mapc;
                    lVar25 = 0;
                    uVar26 = 0;
                    do {
                      lVar27 = (long)GA[g_a + 1000].nblock[uVar26];
                      lVar29 = lVar22 % lVar27;
                      plo_loc[uVar26 - 0x20] = pCVar11[lVar29 + lVar25];
                      if (lVar29 == lVar27 + -1) {
                        CVar24 = GA[g_a + 1000].dims[uVar26];
                      }
                      else {
                        CVar24 = pCVar11[lVar29 + lVar25 + 1] + -1;
                      }
                      lVar25 = lVar25 + lVar27;
                      _hi[uVar26] = CVar24;
                      uVar26 = uVar26 + 1;
                      lVar22 = lVar22 / lVar27;
                    } while (uVar28 != uVar26);
                  }
                }
              }
              else {
                lVar25 = *plVar23;
                if (lVar25 < GA[lVar1].num_rstrctd) {
                  if (0 < (short)uVar5) {
                    lVar22 = 1;
                    uVar26 = 0;
                    do {
                      lVar22 = lVar22 * GA[g_a + 1000].nblock[uVar26];
                      uVar26 = uVar26 + 1;
                    } while (uVar28 != uVar26);
                    if ((lVar25 < 0) || (lVar22 <= lVar25)) goto LAB_0018ada2;
                    if (0 < (short)uVar5) {
                      pCVar11 = GA[lVar1].mapc;
                      lVar22 = 0;
                      uVar26 = 0;
                      do {
                        lVar27 = (long)GA[g_a + 1000].nblock[uVar26];
                        lVar29 = lVar25 % lVar27;
                        plo_loc[uVar26 - 0x20] = pCVar11[lVar29 + lVar22];
                        if (lVar29 == lVar27 + -1) {
                          CVar24 = GA[g_a + 1000].dims[uVar26];
                        }
                        else {
                          CVar24 = pCVar11[lVar29 + lVar22 + 1] + -1;
                        }
                        lVar22 = lVar22 + lVar27;
                        _hi[uVar26] = CVar24;
                        uVar26 = uVar26 + 1;
                        lVar25 = lVar25 / lVar27;
                      } while (uVar28 != uVar26);
                    }
                  }
                }
                else if (0 < (short)uVar5) {
                  sVar15 = (ulong)uVar5 << 3;
LAB_0018adbf:
                  memset(err_string,0,sVar15);
                  memset(_hi,0xff,sVar15);
                }
              }
            }
            if (uVar28 == 1) {
              ld_rem[0] = (_hi[0] - err_string._0_8_) + pgVar12[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar5 < 2) {
              lVar25 = 1;
              lVar22 = 0;
            }
            else {
              lVar25 = 1;
              lVar22 = 0;
              lVar29 = 0;
              do {
                lVar22 = lVar22 + plo_rem[lVar29] * lVar25;
                lVar27 = (_hi[lVar29] - plo_loc[lVar29 + -0x20]) +
                         pgVar12[g_a + 1000].width[lVar29] * 2 + 1;
                ld_rem[lVar29] = lVar27;
                lVar25 = lVar25 * lVar27;
                lVar29 = lVar29 + 1;
              } while (uVar28 - 1 != lVar29);
            }
            plVar3[1] = (long)(pgVar12[lVar1].ptr[*plVar23] +
                              (long)pgVar12[lVar1].elemsize *
                              (lVar25 * plo_rem[uVar28 - 1] + lVar22));
            *(int *)(plVar3 + 3) = iVar7;
            *piVar17 = iVar7;
            if (sVar4 != 1) {
              lVar25 = 0;
              do {
                *(int *)((long)piVar17 + lVar25) =
                     *(int *)((long)piVar17 + lVar25) * *(int *)((long)ld_rem + lVar25 * 2);
                *(int *)((long)plVar3 + lVar25 + 0x18) =
                     *(int *)((long)plVar3 + lVar25 + 0x18) * *(int *)((long)ld_loc + lVar25 * 2);
                *(undefined4 *)((long)plVar3 + lVar25 + ndim * 4 + 0x1c) =
                     *(undefined4 *)((long)piVar17 + lVar25);
                *(undefined4 *)((long)plVar3 + lVar25 + 0x1c) =
                     *(undefined4 *)((long)plVar3 + lVar25 + 0x18);
                lVar25 = lVar25 + 4;
              } while (lVar20 != lVar25);
            }
            lVar25 = 0;
            do {
              piVar2[lVar25] = ((int)phi_rem[lVar25] - (int)plo_rem[lVar25]) + 1;
              lVar25 = lVar25 + 1;
            } while (ndim != lVar25);
            *piVar2 = *piVar2 * iVar7;
            if (-1 < iVar6) {
              *plVar23 = (long)PGRP_LIST[iVar6].inv_map_proc_list[*plVar23];
            }
            if (iVar8 != 0) {
              increment[IVar30] = lVar10 * 2;
            }
          }
          IVar30 = IVar30 + 1;
        } while (IVar30 != ndim);
      }
      free(map);
      free(proclist);
      lVar19 = 1;
    }
  }
  return lVar19;
}

Assistant:

logical pnga_set_update5_info(Integer g_a)
{
  int i;
  Integer *proc_rem;
  Integer size, ndim, nwidth, increment[MAXDIM],np;
  Integer width[MAXDIM];
  Integer dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM]/*, phi_loc[MAXDIM]*/;
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer slo_rem[MAXDIM], shi_rem[MAXDIM];
  Integer plo_rem[MAXDIM], phi_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  int *stride_loc, *stride_rem,*count;
  int idx, corner_flag;
  char **ptr_loc, **ptr_rem,*cache;
  Integer handle = GA_OFFSET + g_a;
  int cache_size;
#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
  int scope;
#endif
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine sets up the arrays that are used to transfer data
   * using the update5 algorithm. The arrays begining with the character
   * "p" represent relative indices marking the location of the data set
   * relative to the origin the local patch of the global array, all
   * other indices are in absolute coordinates and mark locations in the
   * total global array. The indices used by this routine are described
   * below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rem[], hi_rem[]: The lower and upper indices of the block
   *       of data on a remote processor or processors that is needed to
   *       fill in the calling processors ghost cells. These indices are
   *       NOT corrected for wrap-around (periodic) boundary conditions
   *       so they can be negative or greater than the array dimension
   *       values held in dims[].
   *
   *       slo_rem[], shi_rem[]: Similar to lo_rem[] and hi_rem[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions. 
   *
   *       thi_rem[], thi_rem[]: The lower and upper indices of the visible
   *       data on a remote processor.
   *
   *       plo_loc[], phi_loc[]: The indices of the local data patch that
   *       is going to be updated.
   *
   *       plo_rem[], phi_rem[]: The indices of the data patch on the
   *       remote processor that will be used to update the data on the
   *       calling processor. Note that the dimensions of the patches
   *       represented by plo_loc[], plo_rem[] and plo_loc[], phi_loc[]
   *       must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  size = GA[handle].elemsize;
  cache_size = 2*sizeof(char *)+3*sizeof(int)+sizeof(Integer);
  cache_size = 2*ndim*((cache_size/sizeof(double)) + 1);
  GA[handle].cache = (double *)malloc(sizeof(double)*cache_size);
  cache = (char *)GA[handle].cache;
  corner_flag = GA[handle].corner_flag;

  pnga_distribution(g_a,me,lo_loc,hi_loc); 
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1){
      *(char **)cache = NULL; 
      return FALSE;
    }
  } 

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_set_update5_info:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_set_update5_info:malloc failed (_ga_proclist)",0);

#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
  for(scope=0;scope < 2; scope ++)
#endif
    for (idx=0; idx < ndim; idx++) {
      nwidth = width[idx];
      if (nwidth != 0) {  
      
        ptr_rem = (char **)cache;
        ptr_loc = (char **)(cache+sizeof(char *));
        stride_loc = (int *)(cache+2*sizeof(char *));
        stride_rem = (int *)(stride_loc+ndim);
        count = (int *)(stride_rem+ndim);
        proc_rem = (Integer *)(count+ndim);

        get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                             dims, width);
        if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
            _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
            slo_rem, shi_rem, g_a);

        *proc_rem = (Integer)_ga_proclist[0];
        if (p_handle >= 0) {
          *proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem];
        }

#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
        if(scope == 0 && ARMCI_Same_node(*proc_rem))
          goto do_negative;
#endif

        cache = (char *)(proc_rem+1);

        pnga_distribution(g_a, *proc_rem, tlo_rem, thi_rem);
        

        for (i = 0; i < ndim; i++) {
          if (increment[i] == 0) {
            if (i == idx) {
              plo_rem[i] = thi_rem[i] - tlo_rem[i] + width[i] + 1;
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + 2*width[i];
              plo_loc[i] = width[i];
              /*phi_loc[i] = 2*width[i] - 1;*/
            } else {
              plo_rem[i] = width[i];
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
              plo_loc[i] = width[i];
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
            }
          } else {
            plo_rem[i] = 0;
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
            plo_loc[i] = 0;
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
          }
        }
        gam_LocationWithGhosts(me, handle, plo_loc, ptr_loc, ld_loc);
        gam_LocationWithGhosts(*proc_rem, handle, plo_rem, ptr_rem, ld_rem);
 
        /* Evaluate strides on local and remote processors */
        gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
            stride_loc);
        gam_ComputeCount(ndim, plo_rem, phi_rem, count);
        count[0] *= size;
        if (p_handle >= 0) {
          *proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem];
        }

#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
        do_negative:
#endif

       /*BJP proc_rem++; */
        ptr_rem = (char **)cache;
        ptr_loc = (char **)(cache+sizeof(char *));
        stride_loc = (int *)(cache+2*sizeof(char *));
        stride_rem = (int *)(stride_loc+ndim);
        count = (int *)(stride_rem+ndim);
        proc_rem = (Integer *)(count+ndim);

        get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                             dims, width);

        if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
            _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
            slo_rem, shi_rem, g_a);

        *proc_rem = (Integer)_ga_proclist[0];
        if (p_handle >= 0) {
          *proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem];
        }

#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
        if(scope == 0 && ARMCI_Same_node(*proc_rem))
          continue;
#endif

        cache = (char *)(proc_rem+1);

        pnga_distribution(g_a, *proc_rem, tlo_rem, thi_rem);



        for (i = 0; i < ndim; i++) {
          if (increment[i] == 0) {
            if (i == idx) {
              plo_rem[i] = 0;
              phi_rem[i] = width[i] - 1;
              plo_loc[i] = hi_loc[i] - lo_loc[i] + width[i] - 1;
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + 2*width[i] - 1;*/
            } else {
              plo_rem[i] = width[i];
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
              plo_loc[i] = width[i];
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
            }
          } else {
            plo_rem[i] = 0;
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
            plo_loc[i] = 0;
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
          }
        }


        gam_LocationWithGhosts(GAme, handle, plo_loc, ptr_loc, ld_loc);
        gam_LocationWithGhosts(*proc_rem, handle, plo_rem, ptr_rem, ld_rem);

        gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
            stride_loc);

        gam_ComputeCount(ndim, plo_rem, phi_rem, count);
        count[0] *= size;
        if (p_handle >= 0) {
          *proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem];
        }

        if (corner_flag)
          increment[idx] = 2*nwidth;
      }
    }
    free(_ga_map);
    free(_ga_proclist);
    return TRUE;
}